

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

char * __thiscall
llvm::detail::IEEEFloat::convertNormalToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  uint partCount;
  uint uVar1;
  int iVar2;
  uint uVar3;
  lostFraction lost_fraction;
  uint uVar4;
  integerPart *parts;
  char *pcVar5;
  byte bVar6;
  bool bVar7;
  char local_a1;
  char *local_90;
  char local_79;
  char *local_78;
  char *q;
  ulong uStack_68;
  uint curDigits;
  integerPart part;
  lostFraction fraction;
  uint bits;
  bool roundUp;
  char *p;
  integerPart *significand;
  char *hexDigitChars;
  uint outputDigits;
  uint partsCount;
  uint shift;
  uint valueBits;
  uint count;
  roundingMode rounding_mode_local;
  bool upperCase_local;
  char *pcStack_18;
  uint hexDigits_local;
  char *dst_local;
  IEEEFloat *this_local;
  
  *dst = '0';
  local_79 = 'X';
  if (!upperCase) {
    local_79 = 'x';
  }
  dst[1] = local_79;
  fraction._3_1_ = lfExactlyZero >> 0x18;
  if (upperCase) {
    local_90 = "0123456789ABCDEF0";
  }
  else {
    local_90 = "0123456789abcdef0";
  }
  parts = significandParts(this);
  partCount = IEEEFloat::partCount(this);
  uVar4 = this->semantics->precision;
  uVar1 = uVar4 + 3;
  iVar2 = 0x40 - (uVar1 & 0x3f);
  uVar3 = significandLSB(this);
  hexDigitChars._0_4_ = (uVar1 - uVar3) + 3 >> 2;
  if ((hexDigits != 0) &&
     (bVar7 = hexDigits < (uint)hexDigitChars, hexDigitChars._0_4_ = hexDigits, bVar7)) {
    uVar1 = uVar1 + hexDigits * -4;
    lost_fraction = lostFractionThroughTruncation(parts,partCount,uVar1);
    fraction._3_1_ = roundAwayFromZero(this,rounding_mode,lost_fraction,uVar1);
  }
  pcVar5 = dst + 3;
  shift = uVar4 + 0x42 >> 6;
  pcStack_18 = pcVar5;
  for (; (uint)hexDigitChars != 0 && shift != 0; hexDigitChars._0_4_ = (uint)hexDigitChars - q._4_4_
      ) {
    uVar4 = shift - 1;
    bVar6 = (byte)iVar2;
    if (uVar4 == partCount) {
      uStack_68 = 0;
    }
    else {
      uStack_68 = parts[uVar4] << (bVar6 & 0x3f);
    }
    if ((uVar4 != 0) && (iVar2 != 0)) {
      uStack_68 = parts[shift - 2] >> (0x40 - bVar6 & 0x3f) | uStack_68;
    }
    q._4_4_ = 0x10;
    if ((uint)hexDigitChars < 0x10) {
      q._4_4_ = (uint)hexDigitChars;
    }
    uVar3 = partAsHex(pcStack_18,uStack_68,q._4_4_,local_90);
    pcStack_18 = pcStack_18 + uVar3;
    shift = uVar4;
  }
  if (fraction._3_1_ == lfExactlyZero >> 0x18) {
    memset(pcStack_18,0x30,(ulong)(uint)hexDigitChars);
    pcStack_18 = pcStack_18 + (uint)hexDigitChars;
  }
  else {
    local_78 = pcStack_18;
    do {
      local_78 = local_78 + -1;
      uVar4 = hexDigitValue(*local_78);
      *local_78 = local_90[uVar4 + 1];
    } while (*local_78 == '0');
    if (local_78 < pcVar5) {
      __assert_fail("q >= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xac1,
                    "char *llvm::detail::IEEEFloat::convertNormalToHexString(char *, unsigned int, bool, roundingMode) const"
                   );
    }
  }
  dst[2] = *pcVar5;
  if (pcStack_18 + -1 == pcVar5) {
    pcStack_18 = pcStack_18 + -1;
  }
  else {
    *pcVar5 = '.';
  }
  local_a1 = 'P';
  if (!upperCase) {
    local_a1 = 'p';
  }
  *pcStack_18 = local_a1;
  pcVar5 = writeSignedDecimal(pcStack_18 + 1,(int)this->exponent);
  return pcVar5;
}

Assistant:

char *IEEEFloat::convertNormalToHexString(char *dst, unsigned int hexDigits,
                                          bool upperCase,
                                          roundingMode rounding_mode) const {
  unsigned int count, valueBits, shift, partsCount, outputDigits;
  const char *hexDigitChars;
  const integerPart *significand;
  char *p;
  bool roundUp;

  *dst++ = '0';
  *dst++ = upperCase ? 'X': 'x';

  roundUp = false;
  hexDigitChars = upperCase ? hexDigitsUpper: hexDigitsLower;

  significand = significandParts();
  partsCount = partCount();

  /* +3 because the first digit only uses the single integer bit, so
     we have 3 virtual zero most-significant-bits.  */
  valueBits = semantics->precision + 3;
  shift = integerPartWidth - valueBits % integerPartWidth;

  /* The natural number of digits required ignoring trailing
     insignificant zeroes.  */
  outputDigits = (valueBits - significandLSB () + 3) / 4;

  /* hexDigits of zero means use the required number for the
     precision.  Otherwise, see if we are truncating.  If we are,
     find out if we need to round away from zero.  */
  if (hexDigits) {
    if (hexDigits < outputDigits) {
      /* We are dropping non-zero bits, so need to check how to round.
         "bits" is the number of dropped bits.  */
      unsigned int bits;
      lostFraction fraction;

      bits = valueBits - hexDigits * 4;
      fraction = lostFractionThroughTruncation (significand, partsCount, bits);
      roundUp = roundAwayFromZero(rounding_mode, fraction, bits);
    }
    outputDigits = hexDigits;
  }

  /* Write the digits consecutively, and start writing in the location
     of the hexadecimal point.  We move the most significant digit
     left and add the hexadecimal point later.  */
  p = ++dst;

  count = (valueBits + integerPartWidth - 1) / integerPartWidth;

  while (outputDigits && count) {
    integerPart part;

    /* Put the most significant integerPartWidth bits in "part".  */
    if (--count == partsCount)
      part = 0;  /* An imaginary higher zero part.  */
    else
      part = significand[count] << shift;

    if (count && shift)
      part |= significand[count - 1] >> (integerPartWidth - shift);

    /* Convert as much of "part" to hexdigits as we can.  */
    unsigned int curDigits = integerPartWidth / 4;

    if (curDigits > outputDigits)
      curDigits = outputDigits;
    dst += partAsHex (dst, part, curDigits, hexDigitChars);
    outputDigits -= curDigits;
  }

  if (roundUp) {
    char *q = dst;

    /* Note that hexDigitChars has a trailing '0'.  */
    do {
      q--;
      *q = hexDigitChars[hexDigitValue (*q) + 1];
    } while (*q == '0');
    assert(q >= p);
  } else {
    /* Add trailing zeroes.  */
    memset (dst, '0', outputDigits);
    dst += outputDigits;
  }

  /* Move the most significant digit to before the point, and if there
     is something after the decimal point add it.  This must come
     after rounding above.  */
  p[-1] = p[0];
  if (dst -1 == p)
    dst--;
  else
    p[0] = '.';

  /* Finally output the exponent.  */
  *dst++ = upperCase ? 'P': 'p';

  return writeSignedDecimal (dst, exponent);
}